

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

void gauden_norm_wt_mean(vector_t ***in_mean,vector_t ***wt_mean,float32 ***dnom,uint32 n_mgau,
                        uint32 n_feat,uint32 n_density,uint32 *veclen)

{
  uint local_3c;
  uint local_38;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 n_density_local;
  uint32 n_feat_local;
  uint32 n_mgau_local;
  float32 ***dnom_local;
  vector_t ***wt_mean_local;
  vector_t ***in_mean_local;
  
  for (k = 0; k < n_mgau; k = k + 1) {
    for (l = 0; l < n_feat; l = l + 1) {
      for (local_38 = 0; local_38 < n_density; local_38 = local_38 + 1) {
        if (((float)dnom[k][l][local_38] != 0.0) || (NAN((float)dnom[k][l][local_38]))) {
          for (local_3c = 0; local_3c < veclen[l]; local_3c = local_3c + 1) {
            wt_mean[k][l][local_38][local_3c] =
                 wt_mean[k][l][local_38][local_3c] / (float)dnom[k][l][local_38];
          }
        }
        else {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,0x61f,"(mgau= %u, feat= %u, density= %u) never observed\n",(ulong)k,(ulong)l,
                  local_38);
          if (in_mean != (vector_t ***)0x0) {
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                    ,0x621,"Copying it from in_mean\n");
            for (local_3c = 0; local_3c < veclen[l]; local_3c = local_3c + 1) {
              wt_mean[k][l][local_38][local_3c] = in_mean[k][l][local_38][local_3c];
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
gauden_norm_wt_mean(vector_t ***in_mean,
		    vector_t ***wt_mean,
		    float32 ***dnom,
		    uint32 n_mgau,
		    uint32 n_feat,
		    uint32 n_density,
		    const uint32 *veclen)
{
    uint32 i, j, k, l;

    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		if (dnom[i][j][k] != 0) {
		    for (l = 0; l < veclen[j]; l++) {
			wt_mean[i][j][k][l] /= dnom[i][j][k];
		    }
		}
		else {
		    E_WARN("(mgau= %u, feat= %u, density= %u) never observed\n",
			   i, j, k);
		    if (in_mean) {
			E_INFO("Copying it from in_mean\n");
			for (l = 0; l < veclen[j]; l++) {
			    wt_mean[i][j][k][l] = in_mean[i][j][k][l];
			}
		    }
		}
	    }
	}
    }
}